

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O0

int version_compare4(char *v1,char *v2,int v1_flags,int v2_flags)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  bool local_ca;
  bool local_c9;
  ulong local_c8;
  int res;
  int v2_exhausted;
  int v1_exhausted;
  int v2_extra_components;
  int v1_extra_components;
  size_t i;
  size_t shift;
  size_t v2_len;
  size_t v1_len;
  component_t v2_components [2];
  component_t v1_components [2];
  int v2_flags_local;
  int v1_flags_local;
  char *v2_local;
  char *v1_local;
  
  v2_local = v1;
  _v2_flags_local = v2;
  v1_components[1].end._4_4_ = v1_flags;
  v1_components[1].end._0_4_ = v2_flags;
  v2_len = 0;
  shift = 0;
  v1_exhausted = (int)((v1_flags & 0xcU) != 0);
  v2_exhausted = (int)((v2_flags & 0xcU) != 0);
  do {
    if (v2_len == 0) {
      v2_len = get_next_version_component
                         (&v2_local,(component_t *)&v2_components[1].end,v1_components[1].end._4_4_)
      ;
    }
    if (shift == 0) {
      shift = get_next_version_component
                        ((char **)&v2_flags_local,(component_t *)&v1_len,(int)v1_components[1].end);
    }
    if (v2_len < shift) {
      local_c8 = v2_len;
    }
    else {
      local_c8 = shift;
    }
    for (_v2_extra_components = 0; _v2_extra_components < local_c8;
        _v2_extra_components = _v2_extra_components + 1) {
      iVar3 = compare_components((component_t *)&v2_components[_v2_extra_components + 1].end,
                                 (component_t *)&v2_components[_v2_extra_components - 1].end);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    if (v2_len != shift) {
      for (_v2_extra_components = 0; _v2_extra_components < local_c8;
          _v2_extra_components = _v2_extra_components + 1) {
        lVar4 = _v2_extra_components + local_c8;
        v2_components[_v2_extra_components + 1].end = v2_components[lVar4 + 1].end;
        uVar2 = *(undefined4 *)&v1_components[lVar4].field_0x4;
        v1_components[_v2_extra_components].metaorder = v1_components[lVar4].metaorder;
        *(undefined4 *)&v1_components[_v2_extra_components].field_0x4 = uVar2;
        v1_components[_v2_extra_components].start = v1_components[lVar4].start;
        lVar4 = _v2_extra_components + local_c8;
        v2_components[_v2_extra_components - 1].end = v2_components[lVar4 + -1].end;
        uVar2 = *(undefined4 *)&v2_components[lVar4].field_0x4;
        v2_components[_v2_extra_components].metaorder = v2_components[lVar4].metaorder;
        *(undefined4 *)&v2_components[_v2_extra_components].field_0x4 = uVar2;
        v2_components[_v2_extra_components].start = v2_components[lVar4].start;
      }
    }
    v2_len = v2_len - local_c8;
    shift = shift - local_c8;
    local_c9 = *v2_local == '\0' && v2_len == 0;
    local_ca = *_v2_flags_local == '\0' && shift == 0;
    if ((local_c9) && (0 < v1_exhausted)) {
      v1_exhausted = v1_exhausted + -1;
      local_c9 = false;
    }
    if ((local_ca) && (0 < v2_exhausted)) {
      v2_exhausted = v2_exhausted + -1;
      local_ca = false;
    }
    bVar1 = true;
    if (local_c9) {
      bVar1 = (bool)(local_ca ^ 1);
    }
  } while (bVar1);
  return 0;
}

Assistant:

int version_compare4(const char* v1, const char* v2, int v1_flags, int v2_flags) {
	component_t v1_components[2], v2_components[2];
	size_t v1_len = 0, v2_len = 0;
	size_t shift, i;

	int v1_extra_components = (v1_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;
	int v2_extra_components = (v2_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;

	int v1_exhausted, v2_exhausted;

	int res;

	do {
		if (v1_len == 0)
			v1_len = get_next_version_component(&v1, v1_components, v1_flags);
		if (v2_len == 0)
			v2_len = get_next_version_component(&v2, v2_components, v2_flags);

		shift = MY_MIN(v1_len, v2_len);
		for (i = 0; i < shift; i++) {
			res = compare_components(&v1_components[i], &v2_components[i]);
			if (res != 0)
				return res;
		}

		if (v1_len != v2_len) {
			for (i = 0; i < shift; i++) {
				v1_components[i] = v1_components[i+shift];
				v2_components[i] = v2_components[i+shift];
			}
		}

		v1_len -= shift;
		v2_len -= shift;

		v1_exhausted = *v1 == '\0' && v1_len == 0;
		v2_exhausted = *v2 == '\0' && v2_len == 0;

		if (v1_exhausted && v1_extra_components > 0) {
			v1_extra_components--;
			v1_exhausted = 0;
		}
		if (v2_exhausted && v2_extra_components > 0) {
			v2_extra_components--;
			v2_exhausted = 0;
		}
	} while (!v1_exhausted || !v2_exhausted);

	return 0;
}